

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall args::Matcher::GetFlagStrings(Matcher *this,string *shortPrefix,string *longPrefix)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference pvVar2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *flag_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  char flag;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagStrings;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  long local_a8;
  undefined1 local_99 [33];
  string local_78 [39];
  char local_51;
  _Node_iterator_base<char,_false> local_50;
  _Node_iterator_base<char,_false> local_48 [4];
  undefined1 local_21;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *local_18;
  
  local_21 = 0;
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11522e);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
          size((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *)
               0x115238);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x11524b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_stack_ffffffffffffff20,(size_type)__lhs);
  local_48[0]._M_cur =
       (__node_type *)
       std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::begin
                 (in_stack_fffffffffffffee8);
  local_50._M_cur =
       (__node_type *)
       std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::end
                 (in_stack_fffffffffffffee8);
  while (bVar1 = std::__detail::operator!=(local_48,&local_50), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<char,_true,_false>::operator*
                       ((_Node_const_iterator<char,_true,_false> *)0x1152c1);
    local_51 = *pvVar2;
    in_stack_fffffffffffffef4 = (int)local_51;
    in_stack_fffffffffffffef8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
    in_stack_fffffffffffffee8 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_99 + 1),1,(char)in_stack_fffffffffffffef4,
               (allocator *)in_stack_fffffffffffffef8);
    std::operator+(in_stack_fffffffffffffef8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)(local_99 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_99);
    std::__detail::_Node_const_iterator<char,_true,_false>::operator++
              ((_Node_const_iterator<char,_true,_false> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  local_a8 = in_RSI + 0x38;
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffee8);
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffee8);
  while (bVar1 = std::__detail::operator!=(&local_b0,&local_b8), bVar1) {
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                 *)0x115440);
    std::operator+(__lhs,__rhs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> GetFlagStrings(const std::string &shortPrefix, const std::string &longPrefix) const
            {
                std::vector<std::string> flagStrings;
                flagStrings.reserve(shortFlags.size() + longFlags.size());
                for (const char flag: shortFlags)
                {
                    flagStrings.emplace_back(shortPrefix + std::string(1, flag));
                }
                for (const std::string &flag: longFlags)
                {
                    flagStrings.emplace_back(longPrefix + flag);
                }
                return flagStrings;
            }